

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall HashUtil_Sha512ByteData160_Test::TestBody(HashUtil_Sha512ByteData160_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_b8;
  Message local_b0;
  string local_a8;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  ByteData byte_data;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData160 target;
  HashUtil_Sha512ByteData160_Test *this_local;
  
  target.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"0123456789abcdef0123456789abcdef01234567",&local_49);
  cfd::core::ByteData160::ByteData160((ByteData160 *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::HashUtil::Sha512((ByteData *)&gtest_ar.message_,(ByteData160 *)local_28);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a8,(ByteData *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_88,"byte_data.GetHex().c_str()",
             "\"a0328b2336a761329ef0ce5bd23743173cad5528bfc21cc7b493ea6a1f4cd7ef888e6fb7ca8f294e8e5f2d2459bc72880522bd43d64e5068bc2a8ea21d27ea70\""
             ,pcVar2,
             "a0328b2336a761329ef0ce5bd23743173cad5528bfc21cc7b493ea6a1f4cd7ef888e6fb7ca8f294e8e5f2d2459bc72880522bd43d64e5068bc2a8ea21d27ea70"
            );
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x135,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)local_28);
  return;
}

Assistant:

TEST(HashUtil, Sha512ByteData160) {
  ByteData160 target("0123456789abcdef0123456789abcdef01234567");
  ByteData byte_data = HashUtil::Sha512(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "a0328b2336a761329ef0ce5bd23743173cad5528bfc21cc7b493ea6a1f4cd7ef888e6fb7ca8f294e8e5f2d2459bc72880522bd43d64e5068bc2a8ea21d27ea70");
}